

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::~vector(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
          *this)

{
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar1;
  memory_resource *pmVar2;
  size_t sVar3;
  bool *pbVar4;
  
  poVar1 = this->ptr;
  sVar3 = this->nStored;
  if (sVar3 == 0) {
    if (poVar1 == (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)0x0) {
      return;
    }
  }
  else {
    pbVar4 = &poVar1->set;
    do {
      if (*pbVar4 == true) {
        *pbVar4 = false;
      }
      pbVar4 = pbVar4 + 0x18;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
    this->nStored = 0;
  }
  pmVar2 = (this->alloc).memoryResource;
  (*pmVar2->_vptr_memory_resource[3])(pmVar2,poVar1,this->nAlloc * 0x18,8);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }